

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

void __thiscall
cmStdIoConnection::SetupStream(cmStdIoConnection *this,uv_stream_t **stream,int file_id)

{
  uv_handle_type uVar1;
  uv_tty_t *tty;
  uv_loop_t *puVar2;
  runtime_error *this_00;
  
  if (*stream != (uv_stream_t *)0x0) {
    __assert_fail("stream == CM_NULLPTR",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerConnection.cxx"
                  ,0x16,"void cmStdIoConnection::SetupStream(uv_stream_t *&, int)");
  }
  uVar1 = uv_guess_handle(file_id);
  if (uVar1 != UV_NAMED_PIPE) {
    if (uVar1 != UV_FILE) {
      if (uVar1 != UV_TTY) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unable to determine input type");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tty = (uv_tty_t *)operator_new(0x138);
      memset(tty,0,0x138);
      puVar2 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server)
      ;
      uv_tty_init(puVar2,tty,file_id,(uint)(file_id == 0));
      uv_tty_set_mode(tty,UV_TTY_MODE_NORMAL);
      goto LAB_0029a2aa;
    }
    if (file_id == 0) {
      return;
    }
  }
  tty = (uv_tty_t *)operator_new(0x108);
  memset(tty,0,0x108);
  puVar2 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  uv_pipe_init(puVar2,(uv_pipe_t *)tty,0);
  uv_pipe_open((uv_pipe_t *)tty,file_id);
LAB_0029a2aa:
  *stream = (uv_stream_t *)tty;
  tty->data = this;
  return;
}

Assistant:

void cmStdIoConnection::SetupStream(uv_stream_t*& stream, int file_id)
{
  assert(stream == CM_NULLPTR);
  switch (uv_guess_handle(file_id)) {
    case UV_TTY: {
      auto tty = new uv_tty_t();
      uv_tty_init(this->Server->GetLoop(), tty, file_id, file_id == 0);
      uv_tty_set_mode(tty, UV_TTY_MODE_NORMAL);
      stream = reinterpret_cast<uv_stream_t*>(tty);
      break;
    }
    case UV_FILE: {
      if (file_id == 0) {
        return;
      }
    }
    case UV_NAMED_PIPE: {
      auto pipe = new uv_pipe_t();
      uv_pipe_init(this->Server->GetLoop(), pipe, 0);
      uv_pipe_open(pipe, file_id);
      stream = reinterpret_cast<uv_stream_t*>(pipe);
      break;
    }
    default:
      throw std::runtime_error("Unable to determine input type");
  }
  stream->data = static_cast<cmEventBasedConnection*>(this);
}